

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigRetF.c
# Opt level: O0

void Aig_ManRetimeMark(Aig_Man_t *p)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  void *pvVar4;
  Aig_Obj_t *pAVar5;
  Aig_Obj_t *pAVar6;
  int local_30;
  int i;
  int fChange;
  Aig_Obj_t *pObjLo;
  Aig_Obj_t *pObjLi;
  Aig_Obj_t *pObj;
  Aig_Man_t *p_local;
  
  local_30 = 0;
  while( true ) {
    iVar2 = Vec_PtrSize(p->vObjs);
    if (iVar2 <= local_30) {
      local_30 = 0;
      while( true ) {
        iVar2 = Aig_ManCiNum(p);
        iVar3 = Aig_ManRegNum(p);
        if (iVar2 - iVar3 <= local_30) break;
        pvVar4 = Vec_PtrEntry(p->vCis,local_30);
        *(ulong *)((long)pvVar4 + 0x18) =
             *(ulong *)((long)pvVar4 + 0x18) & 0xffffffffffffffdf | 0x20;
        local_30 = local_30 + 1;
      }
      local_30 = 0;
      while( true ) {
        iVar2 = Aig_ManRegNum(p);
        if (iVar2 <= local_30) {
          bVar1 = true;
          while (bVar1) {
            bVar1 = false;
            Aig_ManIncrementTravId(p);
            for (local_30 = 0; iVar2 = Vec_PtrSize(p->vCos), local_30 < iVar2;
                local_30 = local_30 + 1) {
              pAVar5 = (Aig_Obj_t *)Vec_PtrEntry(p->vCos,local_30);
              if (((*(ulong *)&pAVar5->field_0x18 >> 5 & 1) == 0) &&
                 (iVar2 = Aig_ManRetimeMark_rec(p,pAVar5), iVar2 != 0)) {
                if ((pAVar5->field_0).pNext != (Aig_Obj_t *)0x0) {
                  *(ulong *)&((pAVar5->field_0).pNext)->field_0x18 =
                       *(ulong *)&((pAVar5->field_0).pNext)->field_0x18 & 0xffffffffffffffdf | 0x20;
                }
                bVar1 = true;
              }
            }
          }
          for (local_30 = 0; iVar2 = Aig_ManRegNum(p), local_30 < iVar2; local_30 = local_30 + 1) {
            pAVar5 = Aig_ManLi(p,local_30);
            pAVar6 = Aig_ManLo(p,local_30);
            (pAVar5->field_0).pNext = (Aig_Obj_t *)0x0;
            (pAVar6->field_0).pNext = (Aig_Obj_t *)0x0;
          }
          return;
        }
        pAVar5 = Aig_ManLi(p,local_30);
        pAVar6 = Aig_ManLo(p,local_30);
        if ((pAVar6->field_0).pNext != (Aig_Obj_t *)0x0) break;
        if ((pAVar5->field_0).pNext != (Aig_Obj_t *)0x0) {
          __assert_fail("pObjLi->pNext == NULL",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/aig/aigRetF.c"
                        ,0x56,"void Aig_ManRetimeMark(Aig_Man_t *)");
        }
        (pAVar6->field_0).pNext = pAVar5;
        (pAVar5->field_0).pNext = pAVar6;
        local_30 = local_30 + 1;
      }
      __assert_fail("pObjLo->pNext == NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/aig/aigRetF.c"
                    ,0x55,"void Aig_ManRetimeMark(Aig_Man_t *)");
    }
    pvVar4 = Vec_PtrEntry(p->vObjs,local_30);
    if ((pvVar4 != (void *)0x0) && ((*(ulong *)((long)pvVar4 + 0x18) >> 5 & 1) != 0)) break;
    local_30 = local_30 + 1;
  }
  __assert_fail("pObj->fMarkB == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/aig/aigRetF.c"
                ,0x4f,"void Aig_ManRetimeMark(Aig_Man_t *)");
}

Assistant:

void Aig_ManRetimeMark( Aig_Man_t * p )
{
    Aig_Obj_t * pObj, * pObjLi, * pObjLo;
    int fChange, i;
    // mark the PIs
    Aig_ManForEachObj( p, pObj, i )
        assert( pObj->fMarkB == 0 );
    Aig_ManForEachPiSeq( p, pObj, i )
        pObj->fMarkB = 1;
    // map registers into each other
    Aig_ManForEachLiLoSeq( p, pObjLi, pObjLo, i )
    {
        assert( pObjLo->pNext == NULL );
        assert( pObjLi->pNext == NULL );
        pObjLo->pNext = pObjLi;
        pObjLi->pNext = pObjLo;
    }
    // iterativively mark the logic reachable from PIs
    fChange = 1;
    while ( fChange )
    {
        fChange = 0;
        Aig_ManIncrementTravId( p );
        Aig_ManForEachCo( p, pObj, i )
        {
            if ( pObj->fMarkB )
                continue;
            if ( Aig_ManRetimeMark_rec( p, pObj ) )
            {
                if ( pObj->pNext )
                    pObj->pNext->fMarkB = 1;
                fChange = 1;
            }
        }
    }
    // clean register mapping
    Aig_ManForEachLiLoSeq( p, pObjLi, pObjLo, i )
        pObjLo->pNext = pObjLi->pNext = NULL;
}